

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.cxx
# Opt level: O2

bool __thiscall
cmTargetLinkLibrariesCommand::InitialPass
          (cmTargetLinkLibrariesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  cmMakefile *pcVar1;
  pointer ppcVar2;
  cmTargetLinkLibraryType right;
  bool bVar3;
  __type _Var4;
  bool bVar5;
  PolicyStatus PVar6;
  int iVar7;
  int iVar8;
  cmake *pcVar9;
  cmTarget *pcVar10;
  ostream *poVar11;
  pointer pbVar12;
  cmTargetLinkLibraryType llt;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  MessageType t;
  int iVar13;
  ulong uVar14;
  pointer pbVar15;
  pointer ppcVar16;
  char *pcVar17;
  string local_1c8;
  ostringstream e;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  if (name == (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"called with incorrect number of arguments",
               (allocator<char> *)&local_1c8);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
LAB_002817d5:
    std::__cxx11::string::~string((string *)&e);
    return false;
  }
  bVar3 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,name);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"can not be used on an ALIAS target.",(allocator<char> *)&local_1c8);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    goto LAB_002817d5;
  }
  pcVar9 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
  pcVar10 = cmGlobalGenerator::FindTarget
                      (pcVar9->GlobalGenerator,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,false);
  this->Target = pcVar10;
  if (pcVar10 == (cmTarget *)0x0) {
    pcVar1 = (this->super_cmCommand).Makefile;
    ppcVar16 = (pcVar1->ImportedTargetsOwned).
               super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppcVar2 = (pcVar1->ImportedTargetsOwned).
              super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      if (ppcVar16 == ppcVar2) {
        pcVar10 = this->Target;
        goto LAB_00281846;
      }
      pcVar10 = *ppcVar16;
      _Var4 = std::operator==(&pcVar10->Name,
                              (args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start);
      ppcVar16 = ppcVar16 + 1;
    } while (!_Var4);
    this->Target = pcVar10;
LAB_00281846:
    if (pcVar10 == (cmTarget *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar11 = std::operator<<((ostream *)&e,"Cannot specify link libraries for target \"");
      poVar11 = std::operator<<(poVar11,(string *)
                                        (args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start);
      poVar11 = std::operator<<(poVar11,"\" ");
      std::operator<<(poVar11,"which is not built by this project.");
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
        PVar6 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0016,false);
        if (PVar6 - REQUIRED_IF_USED < 2) {
          poVar11 = std::operator<<((ostream *)&e,"\n");
          cmPolicies::GetRequiredPolicyError_abi_cxx11_
                    (&local_1c8,(cmPolicies *)&DAT_00000010,id_01);
          std::operator<<(poVar11,(string *)&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
        }
        else {
          if (PVar6 == OLD) goto LAB_00281f4a;
          if (PVar6 == WARN) {
            poVar11 = std::operator<<((ostream *)&e,"\n");
            poVar11 = std::operator<<(poVar11,
                                      "CMake does not support this but it used to work accidentally "
                                     );
            poVar11 = std::operator<<(poVar11,"and is being allowed for compatibility.");
            poVar11 = std::operator<<(poVar11,"\n");
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)&DAT_00000010,id_00);
            std::operator<<(poVar11,(string *)&local_1c8);
            std::__cxx11::string::~string((string *)&local_1c8);
            pcVar1 = (this->super_cmCommand).Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_1c8);
            std::__cxx11::string::~string((string *)&local_1c8);
            goto LAB_00281f4a;
          }
        }
      }
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      cmSystemTools::s_FatalErrorOccured = true;
LAB_00281f4a:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      return true;
    }
  }
  if (pcVar10->TargetTypeValue != UTILITY) goto LAB_0028196b;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  PVar6 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0039,false);
  if (PVar6 - NEW < 3) {
    t = FATAL_ERROR;
    bVar3 = true;
    pcVar17 = "must";
LAB_002818d6:
    poVar11 = std::operator<<((ostream *)&e,"Utility target \"");
    poVar11 = std::operator<<(poVar11,(string *)&this->Target->Name);
    poVar11 = std::operator<<(poVar11,"\" ");
    poVar11 = std::operator<<(poVar11,pcVar17);
    std::operator<<(poVar11," not be used as the target of a target_link_libraries call.");
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,t,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    if (bVar3) {
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      return false;
    }
  }
  else if (PVar6 == WARN) {
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x27,id);
    poVar11 = std::operator<<((ostream *)&e,(string *)&local_1c8);
    std::operator<<(poVar11,"\n");
    std::__cxx11::string::~string((string *)&local_1c8);
    bVar3 = false;
    pcVar17 = "should";
    t = AUTHOR_WARNING;
    goto LAB_002818d6;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
LAB_0028196b:
  pbVar15 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar12 - (long)pbVar15) < 0x21) {
    return true;
  }
  this->CurrentProcessingState = ProcessingLinkLibraries;
  llt = GENERAL_LibraryType;
  bVar3 = false;
  uVar14 = 1;
  do {
    if ((ulong)((long)pbVar12 - (long)pbVar15 >> 5) <= uVar14) {
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar11 = std::operator<<((ostream *)&e,"The \"");
        poVar11 = std::operator<<(poVar11,LinkLibraryTypeNames[llt]);
        std::operator<<(poVar11,"\" argument must be followed by a library.");
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        cmSystemTools::s_FatalErrorOccured = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      }
      PVar6 = cmTarget::GetPolicyStatusCMP0022(this->Target);
      if (WARN < PVar6) {
        return true;
      }
      if (this->CurrentProcessingState == ProcessingLinkLibraries) {
        return true;
      }
      pcVar10 = this->Target;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"LINK_INTERFACE_LIBRARIES",(allocator<char> *)&local_1c8);
      pcVar17 = cmTarget::GetProperty(pcVar10,(string *)&e);
      std::__cxx11::string::~string((string *)&e);
      if (pcVar17 != (char *)0x0) {
        return true;
      }
      pcVar10 = this->Target;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"LINK_INTERFACE_LIBRARIES",(allocator<char> *)&local_1c8);
      cmTarget::SetProperty(pcVar10,(string *)&e,"");
LAB_00281ecf:
      std::__cxx11::string::~string((string *)&e);
      return true;
    }
    bVar5 = std::operator==(pbVar15 + uVar14,"LINK_INTERFACE_LIBRARIES");
    iVar13 = (int)uVar14;
    if (bVar5) {
      this->CurrentProcessingState = ProcessingPlainLinkInterface;
      if (iVar13 != 1) {
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,
                   "The LINK_INTERFACE_LIBRARIES option must appear as the second argument, just after the target name."
                   ,(allocator<char> *)&local_1c8);
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
        goto LAB_00281ecf;
      }
    }
    else {
      bVar5 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar14,"INTERFACE");
      if (bVar5) {
        if ((iVar13 != 1) &&
           ((ProcessingKeywordPrivateInterface < this->CurrentProcessingState ||
            ((0x54U >> (this->CurrentProcessingState & 0x1f) & 1) == 0)))) {
          pcVar1 = (this->super_cmCommand).Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,
                     "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                     ,(allocator<char> *)&local_1c8);
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
          goto LAB_00281ecf;
        }
        this->CurrentProcessingState = ProcessingKeywordLinkInterface;
      }
      else {
        bVar5 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar14,"LINK_PUBLIC");
        if (bVar5) {
          if (((iVar13 != 1) && (this->CurrentProcessingState != ProcessingPlainPublicInterface)) &&
             (this->CurrentProcessingState != ProcessingPlainPrivateInterface)) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&e,
                       "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                       ,(allocator<char> *)&local_1c8);
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
            goto LAB_00281ecf;
          }
          this->CurrentProcessingState = ProcessingPlainPublicInterface;
        }
        else {
          bVar5 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar14,"PUBLIC");
          if (bVar5) {
            if ((iVar13 != 1) &&
               ((ProcessingKeywordPrivateInterface < this->CurrentProcessingState ||
                ((0x54U >> (this->CurrentProcessingState & 0x1f) & 1) == 0)))) {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&e,
                         "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                         ,(allocator<char> *)&local_1c8);
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
              goto LAB_00281ecf;
            }
            this->CurrentProcessingState = ProcessingKeywordPublicInterface;
          }
          else {
            bVar5 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar14,
                                    "LINK_PRIVATE");
            if (bVar5) {
              if (((iVar13 != 1) && (this->CurrentProcessingState != ProcessingPlainPublicInterface)
                  ) && (this->CurrentProcessingState != ProcessingPlainPrivateInterface)) {
                pcVar1 = (this->super_cmCommand).Makefile;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&e,
                           "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second argument, just after the target name."
                           ,(allocator<char> *)&local_1c8);
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
                goto LAB_00281ecf;
              }
              this->CurrentProcessingState = ProcessingPlainPrivateInterface;
            }
            else {
              bVar5 = std::operator==((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar14,"PRIVATE")
              ;
              if (bVar5) {
                if ((iVar13 != 1) &&
                   ((ProcessingKeywordPrivateInterface < this->CurrentProcessingState ||
                    ((0x54U >> (this->CurrentProcessingState & 0x1f) & 1) == 0)))) {
                  pcVar1 = (this->super_cmCommand).Makefile;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&e,
                             "The INTERFACE, PUBLIC or PRIVATE option must appear as the second argument, just after the target name."
                             ,(allocator<char> *)&local_1c8);
                  cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&e);
                  goto LAB_00281ecf;
                }
                this->CurrentProcessingState = ProcessingKeywordPrivateInterface;
              }
              else {
                bVar5 = std::operator==((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar14,"debug")
                ;
                if (bVar5) {
                  if (bVar3) {
                    right = DEBUG_LibraryType;
LAB_00281b55:
                    LinkLibraryTypeSpecifierWarning(this,llt,right);
                    llt = right;
                  }
                  else {
                    llt = DEBUG_LibraryType;
                  }
                }
                else {
                  bVar5 = std::operator==((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar14,
                                          "optimized");
                  if (bVar5) {
                    if (bVar3) {
                      right = OPTIMIZED_LibraryType;
                      goto LAB_00281b55;
                    }
                    llt = OPTIMIZED_LibraryType;
                  }
                  else {
                    bVar5 = std::operator==((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar14,
                                            "general");
                    if (!bVar5) {
                      if (bVar3) {
                        bVar5 = HandleLibrary(this,(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar14,llt);
                        bVar3 = false;
                        if (!bVar5) {
                          return false;
                        }
                      }
                      else {
                        std::__cxx11::string::string
                                  ((string *)&e,
                                   (string *)
                                   (args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start);
                        std::__cxx11::string::append((char *)&e);
                        pcVar17 = cmMakefile::GetDefinition
                                            ((this->super_cmCommand).Makefile,(string *)&e);
                        if (pcVar17 == (char *)0x0) {
                          llt = GENERAL_LibraryType;
                        }
                        else {
                          iVar7 = strcmp(pcVar17,"debug");
                          iVar8 = strcmp(pcVar17,"optimized");
                          llt = OPTIMIZED_LibraryType;
                          if (iVar8 != 0) {
                            llt = (cmTargetLinkLibraryType)(iVar7 == 0);
                          }
                        }
                        bVar5 = HandleLibrary(this,(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar14,llt);
                        std::__cxx11::string::~string((string *)&e);
                        if (!bVar5) {
                          return false;
                        }
                      }
                      goto LAB_00281ba8;
                    }
                    if (bVar3) {
                      LinkLibraryTypeSpecifierWarning(this,llt,0);
                    }
                    llt = GENERAL_LibraryType;
                  }
                }
                bVar3 = true;
              }
            }
          }
        }
      }
    }
LAB_00281ba8:
    uVar14 = (ulong)(iVar13 + 1);
    pbVar15 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar12 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

bool cmTargetLinkLibrariesCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  // Must have at least one argument.
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  // Alias targets cannot be on the LHS of this command.
  if (this->Makefile->IsAlias(args[0])) {
    this->SetError("can not be used on an ALIAS target.");
    return false;
  }

  // Lookup the target for which libraries are specified.
  this->Target =
    this->Makefile->GetCMakeInstance()->GetGlobalGenerator()->FindTarget(
      args[0]);
  if (!this->Target) {
    const std::vector<cmTarget*>& importedTargets =
      this->Makefile->GetOwnedImportedTargets();
    for (cmTarget* importedTarget : importedTargets) {
      if (importedTarget->GetName() == args[0]) {
        this->Target = importedTarget;
        break;
      }
    }
  }
  if (!this->Target) {
    MessageType t = MessageType::FATAL_ERROR; // fail by default
    std::ostringstream e;
    e << "Cannot specify link libraries for target \"" << args[0] << "\" "
      << "which is not built by this project.";
    // The bad target is the only argument. Check how policy CMP0016 is set,
    // and accept, warn or fail respectively:
    if (args.size() < 2) {
      switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0016)) {
        case cmPolicies::WARN:
          t = MessageType::AUTHOR_WARNING;
          // Print the warning.
          e << "\n"
            << "CMake does not support this but it used to work accidentally "
            << "and is being allowed for compatibility."
            << "\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0016);
          break;
        case cmPolicies::OLD: // OLD behavior does not warn.
          t = MessageType::MESSAGE;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
          e << "\n" << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0016);
          break;
        case cmPolicies::NEW: // NEW behavior prints the error.
          break;
      }
    }
    // Now actually print the message.
    switch (t) {
      case MessageType::AUTHOR_WARNING:
        this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
        break;
      case MessageType::FATAL_ERROR:
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
        cmSystemTools::SetFatalErrorOccured();
        break;
      default:
        break;
    }
    return true;
  }

  // Having a UTILITY library on the LHS is a bug.
  if (this->Target->GetType() == cmStateEnums::UTILITY) {
    std::ostringstream e;
    const char* modal = nullptr;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0039)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0039) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        modal = "must";
        messageType = MessageType::FATAL_ERROR;
    }
    if (modal) {
      e << "Utility target \"" << this->Target->GetName() << "\" " << modal
        << " not be used as the target of a target_link_libraries call.";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  // But we might not have any libs after variable expansion.
  if (args.size() < 2) {
    return true;
  }

  // Keep track of link configuration specifiers.
  cmTargetLinkLibraryType llt = GENERAL_LibraryType;
  bool haveLLT = false;

  // Start with primary linking and switch to link interface
  // specification if the keyword is encountered as the first argument.
  this->CurrentProcessingState = ProcessingLinkLibraries;

  // Add libraries, note that there is an optional prefix
  // of debug and optimized that can be used.
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "LINK_INTERFACE_LIBRARIES") {
      this->CurrentProcessingState = ProcessingPlainLinkInterface;
      if (i != 1) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The LINK_INTERFACE_LIBRARIES option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
    } else if (args[i] == "INTERFACE") {
      if (i != 1 &&
          this->CurrentProcessingState != ProcessingKeywordPrivateInterface &&
          this->CurrentProcessingState != ProcessingKeywordPublicInterface &&
          this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The INTERFACE, PUBLIC or PRIVATE option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
      this->CurrentProcessingState = ProcessingKeywordLinkInterface;
    } else if (args[i] == "LINK_PUBLIC") {
      if (i != 1 &&
          this->CurrentProcessingState != ProcessingPlainPrivateInterface &&
          this->CurrentProcessingState != ProcessingPlainPublicInterface) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
      this->CurrentProcessingState = ProcessingPlainPublicInterface;
    } else if (args[i] == "PUBLIC") {
      if (i != 1 &&
          this->CurrentProcessingState != ProcessingKeywordPrivateInterface &&
          this->CurrentProcessingState != ProcessingKeywordPublicInterface &&
          this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The INTERFACE, PUBLIC or PRIVATE option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
      this->CurrentProcessingState = ProcessingKeywordPublicInterface;
    } else if (args[i] == "LINK_PRIVATE") {
      if (i != 1 &&
          this->CurrentProcessingState != ProcessingPlainPublicInterface &&
          this->CurrentProcessingState != ProcessingPlainPrivateInterface) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The LINK_PUBLIC or LINK_PRIVATE option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
      this->CurrentProcessingState = ProcessingPlainPrivateInterface;
    } else if (args[i] == "PRIVATE") {
      if (i != 1 &&
          this->CurrentProcessingState != ProcessingKeywordPrivateInterface &&
          this->CurrentProcessingState != ProcessingKeywordPublicInterface &&
          this->CurrentProcessingState != ProcessingKeywordLinkInterface) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "The INTERFACE, PUBLIC or PRIVATE option must appear as the second "
          "argument, just after the target name.");
        return true;
      }
      this->CurrentProcessingState = ProcessingKeywordPrivateInterface;
    } else if (args[i] == "debug") {
      if (haveLLT) {
        this->LinkLibraryTypeSpecifierWarning(llt, DEBUG_LibraryType);
      }
      llt = DEBUG_LibraryType;
      haveLLT = true;
    } else if (args[i] == "optimized") {
      if (haveLLT) {
        this->LinkLibraryTypeSpecifierWarning(llt, OPTIMIZED_LibraryType);
      }
      llt = OPTIMIZED_LibraryType;
      haveLLT = true;
    } else if (args[i] == "general") {
      if (haveLLT) {
        this->LinkLibraryTypeSpecifierWarning(llt, GENERAL_LibraryType);
      }
      llt = GENERAL_LibraryType;
      haveLLT = true;
    } else if (haveLLT) {
      // The link type was specified by the previous argument.
      haveLLT = false;
      if (!this->HandleLibrary(args[i], llt)) {
        return false;
      }
    } else {
      // Lookup old-style cache entry if type is unspecified.  So if you
      // do a target_link_libraries(foo optimized bar) it will stay optimized
      // and not use the lookup.  As there may be the case where someone has
      // specified that a library is both debug and optimized.  (this check is
      // only there for backwards compatibility when mixing projects built
      // with old versions of CMake and new)
      llt = GENERAL_LibraryType;
      std::string linkType = args[0];
      linkType += "_LINK_TYPE";
      const char* linkTypeString = this->Makefile->GetDefinition(linkType);
      if (linkTypeString) {
        if (strcmp(linkTypeString, "debug") == 0) {
          llt = DEBUG_LibraryType;
        }
        if (strcmp(linkTypeString, "optimized") == 0) {
          llt = OPTIMIZED_LibraryType;
        }
      }
      if (!this->HandleLibrary(args[i], llt)) {
        return false;
      }
    }
  }

  // Make sure the last argument was not a library type specifier.
  if (haveLLT) {
    std::ostringstream e;
    e << "The \"" << cmTargetLinkLibrariesCommand::LinkLibraryTypeNames[llt]
      << "\" argument must be followed by a library.";
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
  }

  const cmPolicies::PolicyStatus policy22Status =
    this->Target->GetPolicyStatusCMP0022();

  // If any of the LINK_ options were given, make sure the
  // LINK_INTERFACE_LIBRARIES target property exists.
  // Use of any of the new keywords implies awareness of
  // this property. And if no libraries are named, it should
  // result in an empty link interface.
  if ((policy22Status == cmPolicies::OLD ||
       policy22Status == cmPolicies::WARN) &&
      this->CurrentProcessingState != ProcessingLinkLibraries &&
      !this->Target->GetProperty("LINK_INTERFACE_LIBRARIES")) {
    this->Target->SetProperty("LINK_INTERFACE_LIBRARIES", "");
  }

  return true;
}